

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotMap.c
# Opt level: O0

void getPath(long path)

{
  long lVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 auStack_1738 [158];
  int *local_1248;
  long local_1240;
  int local_1234;
  undefined8 *local_1230;
  int local_1228 [2];
  int prevChecked [1152];
  int local_20;
  int position;
  int count;
  int j;
  int i;
  Path *path_local;
  
  local_1230 = (undefined8 *)&stack0x00000008;
  local_20 = 0;
  for (count = 0; count < 0x480; count = count + 1) {
    local_1228[count] = 0;
  }
  *(undefined4 *)(path + 8) = 0;
  count = 0;
  do {
    if (0xf < count) {
LAB_00102a07:
      local_1248 = local_1228;
      local_1234 = local_20;
      puVar2 = local_1230;
      puVar3 = auStack_1738;
      local_1240 = path;
      for (lVar1 = 0x9e; lVar1 != 0; lVar1 = lVar1 + -1) {
        *puVar3 = *puVar2;
        puVar2 = puVar2 + 1;
        puVar3 = puVar3 + 1;
      }
      pathSolve(local_1240,local_1248,1,local_1234);
      return;
    }
    for (position = 0; position < 0x48; position = position + 1) {
      if ((&stack0x00000054)[(long)position + (long)count * 0x49] == '$') {
        local_20 = count * 0x48 + position;
        local_1228[0] = local_20;
        goto LAB_00102a07;
      }
    }
    count = count + 1;
  } while( true );
}

Assistant:

void getPath(struct Path *path, struct Map map) {
    int i, j;
    int count = 0;
    int position = 0;
    int prevChecked[MAP_ROWS * MAP_COLS];

    for (i = 0; i < (MAP_ROWS * MAP_COLS); i++)
        prevChecked[i] = 0;
    path->count = 0;
    for (i = 0; i < MAP_ROWS; i++) {
        for (j = 0; j < MAP_COLS; j++) {
            if (map.overlay[i][j] == '$') {
                position = (i * MAP_COLS) + j;
                count = 0;
                prevChecked[count] = position;
                goto outer;
            }
        }
    }

    outer:
    pathSolve(map, path, prevChecked, count + 1, position);

    return;
}